

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ArithmeticExpression::setOperator(ArithmeticExpression *this,String *op)

{
  __type _Var1;
  long in_RDI;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          op);
  if (_Var1) {
    *(undefined4 *)(in_RDI + 0x20) = 0;
  }
  else {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,op);
    if (_Var1) {
      *(undefined4 *)(in_RDI + 0x20) = 1;
    }
    else {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,op);
      if (_Var1) {
        *(undefined4 *)(in_RDI + 0x20) = 2;
      }
      else {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,op);
        if (_Var1) {
          *(undefined4 *)(in_RDI + 0x20) = 3;
        }
      }
    }
  }
  return;
}

Assistant:

void ArithmeticExpression::setOperator( const String& op )
        {
            if ( op == OPERATOR_ARITHMETIC_ADD )
            {
                mOperator = ADD;
            }

            else if ( op == OPERATOR_ARITHMETIC_SUB )
            {
                mOperator = SUB;
            }

            else if ( op == OPERATOR_ARITHMETIC_MUL )
            {
                mOperator = MUL;
            }

            else if ( op == OPERATOR_ARITHMETIC_DIV )
            {
                mOperator = DIV;
            }
        }